

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::detail::read_headers(detail *this,Stream *strm,Headers *headers)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  __ssize_t _Var3;
  undefined8 *puVar4;
  size_t sVar5;
  char **ppcVar6;
  regex *prVar7;
  Headers *extraout_RDX;
  Headers *extraout_RDX_00;
  Headers *extraout_RDX_01;
  Headers *extraout_RDX_02;
  Headers *extraout_RDX_03;
  Headers *extraout_RDX_04;
  Headers *extraout_RDX_05;
  string key;
  string val;
  cmatch m;
  stream_line_reader reader;
  char buf [2048];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> local_8a8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_880;
  undefined1 local_878 [64];
  char local_838 [2056];
  
  local_880 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               *)strm;
  if (read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
      ::re_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                                 ::re_abi_cxx11_);
    headers = extraout_RDX_04;
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                  ::re_abi_cxx11_,"(.+?):\\s*(.+?)\\s*\\r\\n",0x10);
      prVar7 = &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                ::re_abi_cxx11_;
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                    ::re_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                           ::re_abi_cxx11_);
      headers = extraout_RDX_05;
      strm = (Stream *)prVar7;
    }
  }
  prVar7 = (regex *)(local_878 + 0x30);
  local_878._8_8_ = local_838;
  local_878._16_8_ = 0x800;
  local_878._40_8_ = 0;
  local_878[0x30] = '\0';
  local_878._0_8_ = this;
  local_878._32_8_ = prVar7;
  while( true ) {
    _Var3 = stream_line_reader::getline
                      ((stream_line_reader *)local_878,(char **)strm,(size_t *)headers,
                       (FILE *)prVar7);
    if ((char)_Var3 == '\0') break;
    puVar4 = (undefined8 *)(local_878 + 0x20);
    if (local_878._40_8_ == 0) {
      puVar4 = (undefined8 *)(local_878 + 8);
    }
    __s1 = (char *)*puVar4;
    iVar2 = strcmp(__s1,"\r\n");
    if (iVar2 == 0) break;
    local_8a8.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8a8._M_begin = (char *)0x0;
    local_8a8.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8a8.
    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar5 = strlen(__s1);
    strm = (Stream *)(__s1 + sVar5);
    prVar7 = &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
              ::re_abi_cxx11_;
    bVar1 = std::__detail::
            __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s1,(char *)strm,&local_8a8,
                       &read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)
                        ::re_abi_cxx11_,0);
    headers = extraout_RDX;
    if (bVar1) {
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar1 = false;
      }
      else {
        bVar1 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 5U <
                0xfffffffffffffffe;
      }
      if (bVar1) {
        ppcVar6 = (char **)((long)local_8a8.
                                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x18);
      }
      else {
        ppcVar6 = (char **)&((FILE *)((long)local_8a8.
                                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                            _offset;
      }
      if (*(char *)(ppcVar6 + 2) == '\x01') {
        local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,*ppcVar6,ppcVar6[1]);
      }
      else {
        local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
        local_8e8._M_string_length = 0;
        local_8e8.field_2._M_local_buf[0] = '\0';
      }
      if (local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_8a8.
          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar1 = false;
      }
      else {
        bVar1 = ((long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_8a8.
                       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 6U <
                0xfffffffffffffffd;
      }
      if (bVar1) {
        ppcVar6 = (char **)((long)local_8a8.
                                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x30);
        prVar7 = (regex *)local_8a8.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ppcVar6 = (char **)&((FILE *)((long)local_8a8.
                                            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + -0xd8))->
                            _offset;
        prVar7 = (regex *)ppcVar6;
      }
      if (*(char *)(ppcVar6 + 2) == '\x01') {
        local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,*ppcVar6,ppcVar6[1]);
      }
      else {
        local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
        local_8c8._M_string_length = 0;
        local_8c8.field_2._M_local_buf[0] = '\0';
      }
      strm = (Stream *)&local_8e8;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::__cxx11::string&,std::__cxx11::string&>
                (local_880,&local_8e8,&local_8c8);
      headers = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
        strm = (Stream *)
               (CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                         local_8c8.field_2._M_local_buf[0]) + 1);
        operator_delete(local_8c8._M_dataplus._M_p,(ulong)strm);
        headers = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
        strm = (Stream *)
               (CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                         local_8e8.field_2._M_local_buf[0]) + 1);
        operator_delete(local_8e8._M_dataplus._M_p,(ulong)strm);
        headers = extraout_RDX_02;
      }
    }
    if ((FILE *)local_8a8.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (FILE *)0x0) {
      strm = (Stream *)
             ((long)local_8a8.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_8a8.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      operator_delete(local_8a8.
                      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)strm);
      headers = extraout_RDX_03;
    }
  }
  if ((FILE *)local_878._32_8_ != (FILE *)(local_878 + 0x30)) {
    operator_delete((void *)local_878._32_8_,CONCAT71(local_878._49_7_,local_878[0x30]) + 1);
  }
  return (bool)(char)_Var3;
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers)
{
    static std::regex re(R"((.+?):\s*(.+?)\s*\r\n)");

    const auto bufsiz = 2048;
    char buf[bufsiz];

    stream_line_reader reader(strm, buf, bufsiz);

    for (;;) {
        if (!reader.getline()) {
            return false;
        }
        if (!strcmp(reader.ptr(), "\r\n")) {
            break;
        }
        std::cmatch m;
        if (std::regex_match(reader.ptr(), m, re)) {
            auto key = std::string(m[1]);
            auto val = std::string(m[2]);
            headers.emplace(key, val);
        }
    }

    return true;
}